

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseData<(anonymous_namespace)::Foo>::notify
          (PromiseData<(anonymous_namespace)::Foo> *this,QVector<Handler> *handlers)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  char cVar4;
  QObject *pQVar5;
  QEvent *this_01;
  long lVar6;
  QThread *pQVar7;
  function<void_(const_double_&)> *__x;
  _Any_data local_60;
  code *local_50;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  
  peVar1 = (this->m_value).m_data.
           super___shared_ptr<(anonymous_namespace)::Foo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_value).m_data.
            super___shared_ptr<(anonymous_namespace)::Foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar6 = (handlers->d).size;
  if (lVar6 != 0) {
    ppVar2 = (handlers->d).ptr;
    lVar6 = lVar6 * 0x30;
    do {
      __x = &ppVar2->second;
      std::function<void_(const_(anonymous_namespace)::Foo_&)>::function
                ((function<void_(const_(anonymous_namespace)::Foo_&)> *)&local_60,
                 (function<void_(const_(anonymous_namespace)::Foo_&)> *)__x);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_40 = peVar1;
      p_Stack_38 = this_00;
      if ((*(long *)((long)(__x + -1) + 0x10) != 0) &&
         (*(long *)((long)(__x + -1) + 0x18) != 0 &&
          *(int *)(*(long *)((long)(__x + -1) + 0x10) + 4) != 0)) {
        cVar4 = QThread::isFinished();
        if (cVar4 == '\0') {
          if ((*(long *)((long)(__x + -1) + 0x10) == 0) ||
             (*(int *)(*(long *)((long)(__x + -1) + 0x10) + 4) == 0)) {
            pQVar7 = (QThread *)0x0;
          }
          else {
            pQVar7 = *(QThread **)((long)(__x + -1) + 0x18);
          }
          pQVar5 = (QObject *)QAbstractEventDispatcher::instance(pQVar7);
          if (pQVar5 == (QObject *)0x0) {
            cVar4 = QCoreApplication::closingDown();
            if (cVar4 != '\0') goto LAB_00118d10;
          }
          this_01 = (QEvent *)operator_new(0x40);
          QEvent::QEvent(this_01,None);
          *(undefined ***)this_01 = &PTR__Event_0014fbb8;
          std::function<void_(const_(anonymous_namespace)::Foo_&)>::function
                    ((function<void_(const_(anonymous_namespace)::Foo_&)> *)(this_01 + 0x10),
                     (function<void_(const_(anonymous_namespace)::Foo_&)> *)&local_60);
          p_Var3 = p_Stack_38;
          p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(element_type **)(this_01 + 0x30) = local_40;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_01 + 0x38) = p_Var3;
          local_40 = (element_type *)0x0;
          QCoreApplication::postEvent(pQVar5,this_01,0);
        }
      }
LAB_00118d10:
      if (p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
      }
      if (local_50 != (code *)0x0) {
        (*local_50)(&local_60,&local_60,__destroy_functor);
      }
      ppVar2 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)(__x + 1);
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != 0);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void notify(const QVector<Handler>& handlers) Q_DECL_OVERRIDE
    {
        PromiseValue<T> value = m_value;
        Q_ASSERT(!value.isNull());

        for (const auto& handler : handlers) {
            const auto& fn = handler.second;
            qtpromise_defer(
                [=]() {
                    fn(value.data());
                },
                handler.first);
        }
    }